

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_mask.cpp
# Opt level: O3

void __thiscall
cppurses::detail::Screen_mask::Screen_mask(Screen_mask *this,Widget *w,Constructor_tag tag)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  allocator_type local_2a;
  bool local_29;
  
  sVar4 = (w->top_left_position_).x;
  if (tag == Outer) {
    sVar3 = (w->top_left_position_).y;
    (this->offset_).x = sVar4;
    (this->offset_).y = sVar3;
    sVar4 = w->outer_width_;
    sVar3 = w->outer_height_;
  }
  else {
    sVar1 = Border_offset::west(w);
    sVar3 = (w->top_left_position_).y;
    sVar2 = Border_offset::north(w);
    (this->offset_).x = sVar1 + sVar4;
    (this->offset_).y = sVar2 + sVar3;
    sVar4 = w->outer_width_;
    sVar3 = Border_offset::east(w);
    sVar1 = Border_offset::west(w);
    sVar4 = sVar4 - (sVar1 + sVar3);
    sVar3 = w->outer_height_;
    sVar1 = Border_offset::north(w);
    sVar2 = Border_offset::south(w);
    sVar3 = sVar3 - (sVar2 + sVar1);
  }
  (this->area_).width = sVar4;
  (this->area_).height = sVar3;
  local_29 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->bits_,sVar3 * sVar4,&local_29,&local_2a);
  return;
}

Assistant:

Screen_mask::Screen_mask(const Widget& w, Constructor_tag tag)
    : offset_{make_offset(w, tag)},
      area_{make_area(w, tag)},
      bits_(area_.width * area_.height) {}